

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O1

string * __thiscall
ParserProbModelXML::GetVariableName_abi_cxx11_
          (string *__return_storage_ptr__,ParserProbModelXML *this,xmlNodePtr node)

{
  long lVar1;
  char *__s;
  ulong uVar2;
  string name;
  allocator<char> local_31;
  string local_30;
  
  lVar1 = xmlHasProp(node,"name");
  if (lVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Warning: Attempted to extract the name of a nameless node",
               0x39);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    __s = (char *)xmlGetProp(node,"name");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,__s,&local_31);
    lVar1 = std::__cxx11::string::find_last_not_of((char *)&local_30,0x50813d,0xffffffffffffffff);
    if ((lVar1 - 1U < local_30._M_string_length - 1) && (local_30._M_dataplus._M_p[lVar1] == ']')) {
      uVar2 = lVar1 - 2;
      if (local_30._M_string_length < uVar2) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                   uVar2);
      }
      local_30._M_dataplus._M_p[uVar2] = '\0';
      local_30._M_string_length = uVar2;
    }
    StringTools::Trim(__return_storage_ptr__,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string ParserProbModelXML::GetVariableName(const xmlNodePtr node) const
{
    if(!xmlHasProp(node, (xmlChar*) "name")){
        cout << "Warning: Attempted to extract the name of a nameless node" << endl;
        return "";
    }
    string name = (char*) xmlGetProp(node, (xmlChar*) "name");
    size_t pos = name.find_last_not_of(" \t");
    //remove the [0]/[1] tag from the name if it exists (for older versions of OpenMarkov).
    if(pos <= name.length()-1 && pos > 0)
    {
        if(name[pos] == ']')
            name.erase(pos-2);
    }
    //remove remaining whitespace
    return StringTools::Trim(name);
}